

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void __thiscall
re2::Prog::MarkRoots
          (Prog *this,SparseArray<int> *rootmap,SparseSet *q,vector<int,_std::allocator<int>_> *stk)

{
  iterator iVar1;
  Inst *pIVar2;
  bool bVar3;
  pointer piVar4;
  uint uVar5;
  uint uVar6;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_38;
  int local_34;
  
  SparseArray<int>::set_new(rootmap,0,rootmap->size_);
  uVar6 = this->start_unanchored_;
  if ((long)(int)uVar6 < 0) {
LAB_0013a48e:
    __assert_fail("(i) >= (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x134,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
  }
  if ((int)uVar6 < rootmap->max_size_) {
    if ((((uint)rootmap->max_size_ <= uVar6) ||
        ((uint)rootmap->size_ <= (uint)rootmap->sparse_to_dense_[(int)uVar6])) ||
       ((rootmap->dense_).
        super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
        ._M_impl.super__Vector_impl_data._M_start[rootmap->sparse_to_dense_[(int)uVar6]].index_ !=
        uVar6)) {
      SparseArray<int>::set_new(rootmap,uVar6,rootmap->size_);
    }
    uVar6 = this->start_;
    if ((long)(int)uVar6 < 0) goto LAB_0013a48e;
    if ((int)uVar6 < rootmap->max_size_) {
      if ((((uint)rootmap->max_size_ <= uVar6) ||
          ((uint)rootmap->size_ <= (uint)rootmap->sparse_to_dense_[(int)uVar6])) ||
         ((rootmap->dense_).
          super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
          ._M_impl.super__Vector_impl_data._M_start[rootmap->sparse_to_dense_[(int)uVar6]].index_ !=
          uVar6)) {
        SparseArray<int>::set_new(rootmap,uVar6,rootmap->size_);
      }
      q->size_ = 0;
      piVar4 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish != piVar4) {
        (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = piVar4;
      }
      local_34 = this->start_unanchored_;
      iVar1._M_current =
           (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar1._M_current ==
          (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(stk,iVar1,&local_34);
      }
      else {
        *iVar1._M_current = local_34;
        (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar1._M_current + 1;
      }
      piVar4 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
      if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start != piVar4) {
        do {
          uVar6 = piVar4[-1];
          (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = piVar4 + -1;
          do {
            bVar3 = SparseSet::contains(q,uVar6);
            if (bVar3) break;
            SparseSet::insert_new(q,uVar6);
            pIVar2 = this->inst_;
            uVar5 = pIVar2[(int)uVar6].out_opcode_;
            switch(uVar5 & 7) {
            case 0:
            case 1:
              if ((pIVar2[(int)uVar6].out_opcode_ & 6) != 0) {
                __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                              "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                              ,0x6d,"int re2::Prog::Inst::out1()");
              }
              local_38 = pIVar2[(int)uVar6].field_1;
              iVar1._M_current =
                   (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar1._M_current ==
                  (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (stk,iVar1,&local_38.cap_);
              }
              else {
                *iVar1._M_current = (int)local_38;
                (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_finish = iVar1._M_current + 1;
              }
              goto LAB_0013a41f;
            default:
              uVar5 = uVar5 >> 4;
              if (rootmap->max_size_ <= (int)uVar5) goto LAB_0013a450;
              if ((((uint)rootmap->max_size_ <= uVar5) ||
                  ((uint)rootmap->size_ <= (uint)rootmap->sparse_to_dense_[uVar5])) ||
                 ((rootmap->dense_).
                  super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
                  ._M_impl.super__Vector_impl_data._M_start[rootmap->sparse_to_dense_[uVar5]].index_
                  != uVar5)) {
                SparseArray<int>::set_new(rootmap,uVar5,rootmap->size_);
              }
LAB_0013a41f:
              uVar6 = pIVar2[(int)uVar6].out_opcode_ >> 4;
              bVar3 = true;
              break;
            case 5:
            case 7:
              bVar3 = false;
              break;
            case 6:
              uVar6 = uVar5 >> 4;
              bVar3 = true;
            }
          } while (bVar3);
          piVar4 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        } while ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start != piVar4);
      }
      return;
    }
  }
LAB_0013a450:
  __assert_fail("(i) < (max_size_)",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                ,0x135,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
}

Assistant:

void Prog::MarkRoots(SparseArray<int>* rootmap,
                     SparseSet* q, vector<int>* stk) {
  // Mark the kInstFail instruction.
  rootmap->set_new(0, rootmap->size());

  // Mark the start_unanchored and start instructions.
  if (!rootmap->has_index(start_unanchored()))
    rootmap->set_new(start_unanchored(), rootmap->size());
  if (!rootmap->has_index(start()))
    rootmap->set_new(start(), rootmap->size());

  q->clear();
  stk->clear();
  stk->push_back(start_unanchored());
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (q->contains(id))
      continue;
    q->insert_new(id);

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        // Mark the out of this instruction.
        if (!rootmap->has_index(ip->out()))
          rootmap->set_new(ip->out(), rootmap->size());
        id = ip->out();
        goto Loop;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }
}